

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalOrLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalor(NeuralNetworkLayer *this)

{
  bool bVar1;
  LogicalOrLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_logicalor(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicalor(this);
    this_00 = (LogicalOrLayerParams *)operator_new(0x18);
    LogicalOrLayerParams::LogicalOrLayerParams(this_00);
    (this->layer_).logicalor_ = this_00;
  }
  return (LogicalOrLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalOrLayerParams* NeuralNetworkLayer::mutable_logicalor() {
  if (!has_logicalor()) {
    clear_layer();
    set_has_logicalor();
    layer_.logicalor_ = new ::CoreML::Specification::LogicalOrLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalOr)
  return layer_.logicalor_;
}